

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O2

int __thiscall KParser::_decassign(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  pointer pTVar2;
  uint uVar3;
  mapped_type *pmVar4;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  BlockInfo local_168;
  char buf [256];
  
  pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pTVar2[begin].tokenType == id) && (pTVar2[(long)begin + 1].tokenType == decassign)) {
    BlockInfo::BlockInfo(&local_168,bi);
    uVar3 = _expr(this,begin + 2,&local_168);
    BlockInfo::~BlockInfo(&local_168);
    if ((int)uVar3 < 0) {
      sprintf(buf,anon_var_dwarf_1373d,
              (ulong)(uint)(this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                           _M_impl.super__Vector_impl_data._M_start[begin + 2].line);
      std::__cxx11::string::string((string *)&local_1e8,buf,&local_1e9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_1e8);
    }
    else {
      pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pTVar2[uVar3].tokenType == semicolon) {
        this->m_locals = this->m_locals + 1;
        std::__cxx11::string::string((string *)&local_188,"pop",(allocator *)buf);
        std::__cxx11::string::string
                  ((string *)&local_1a8,
                   (string *)
                   ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_start + begin));
        std::__cxx11::string::string
                  ((string *)&local_1c8,anon_var_dwarf_13527 + 0x22,(allocator *)&local_1e8);
        addCode(this,&local_188,&local_1a8,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_188);
        iVar1 = this->m_increaseLocals;
        this->m_increaseLocals = iVar1 + 1;
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->m_varToLocal,
                              &(this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                               _M_impl.super__Vector_impl_data._M_start[begin].str);
        *pmVar4 = iVar1;
        printf("%s => %d\n",
               (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start[begin].str._M_dataplus._M_p,
               (ulong)(uint)this->m_increaseLocals);
        return uVar3 + 1;
      }
      sprintf(buf,anon_var_dwarf_13749,(ulong)(uint)pTVar2[uVar3].line);
      std::__cxx11::string::string((string *)&local_1e8,buf,&local_1e9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_1e8);
    }
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  return -1;
}

Assistant:

int KParser::_decassign(int begin,  BlockInfo bi) {
    int i = begin;
    int t;
    int idIndex = i;
    if (m_tokens[i].tokenType != TokenType::id) {
        return -1;
    } 
    i++; 
    if (m_tokens[i].tokenType != TokenType::decassign) {
        return -1;
    } 
    i++; 

    int exprIndex = i;
    t = _expr(i, bi);
    if (t < 0) {
        char buf[256];
        sprintf(buf, "line[%d]: decassign 표현식의 오류\n", m_tokens[i].line); 
        m_errorMsgs.push_back(buf);
        return -1;
    } 
    i = t;

    if (m_tokens[i].tokenType != TokenType::semicolon) {
        char buf[256];
        sprintf(buf, "line[%d]: _decassign ; 가 빠졌습니다.\n", m_tokens[i].line); 
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;
    m_locals++;
    addCode("pop", m_tokens[idIndex].str, "");
    m_varToLocal[m_tokens[idIndex].str] = m_increaseLocals++;
    printf("%s => %d\n",  m_tokens[idIndex].str.c_str(), m_increaseLocals);
    return i;
}